

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBStream::peek(CBStream *this,CBString *s)

{
  int iVar1;
  CBStringException *this_00;
  bstring local_80;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  CBString *s_local;
  CBStream *this_local;
  
  (s->super_tagbstring).slen = 0;
  local_80 = (bstring)0x0;
  if (s != (CBString *)0x0) {
    local_80 = &s->super_tagbstring;
  }
  bstr__cppwrapper_exception.msg.field_2._8_8_ = s;
  iVar1 = bspeek(local_80,this->m_s);
  if (iVar1 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"CBString::Failed peek",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_40);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBStream::peek (CBString& s) const {
	s.slen = 0;
	if (0 > bspeek ((bstring) &s, m_s)) {
		bstringThrow ("Failed peek");
	}
}